

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Search_Digits_BitState(int i)

{
  int i_local;
  
  SearchDigits(i,SearchBitState);
  return;
}

Assistant:

void Search_Digits_BitState(int i)         { SearchDigits(i, SearchBitState); }